

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stl.h
# Opt level: O0

handle pybind11::detail::
       list_caster<std::vector<std::pair<unsigned_int,unsigned_int>,std::allocator<std::pair<unsigned_int,unsigned_int>>>,std::pair<unsigned_int,unsigned_int>>
       ::
       cast<std::vector<std::pair<unsigned_int,unsigned_int>,std::allocator<std::pair<unsigned_int,unsigned_int>>>&>
                 (vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                  *src,return_value_policy policy,handle parent)

{
  bool bVar1;
  PyObject **ppPVar2;
  undefined8 in_RDX;
  vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
  *in_RDI;
  object value_;
  pair<unsigned_int,_unsigned_int> *value;
  iterator __end0;
  iterator __begin0;
  vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
  *__range3;
  size_t index;
  list l;
  vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
  *in_stack_ffffffffffffff48;
  __normal_iterator<std::pair<unsigned_int,_unsigned_int>_*,_std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_>
  *in_stack_ffffffffffffff50;
  handle in_stack_ffffffffffffff58;
  handle in_stack_ffffffffffffff60;
  handle in_stack_ffffffffffffff68;
  list *in_stack_ffffffffffffff70;
  handle local_88;
  uint local_7c;
  undefined8 local_78;
  PyObject *local_60;
  handle local_58;
  reference local_50;
  pair<unsigned_int,_unsigned_int> *local_48;
  __normal_iterator<std::pair<unsigned_int,_unsigned_int>_*,_std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_>
  local_40;
  vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
  *local_38;
  long local_30;
  handle local_28 [2];
  vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
  *local_18;
  undefined8 local_10;
  handle local_8;
  
  local_18 = in_RDI;
  local_10 = in_RDX;
  std::
  vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
  ::size(in_RDI);
  list::list(in_stack_ffffffffffffff70,(size_t)in_stack_ffffffffffffff68.m_ptr);
  local_30 = 0;
  local_38 = local_18;
  local_40._M_current =
       (pair<unsigned_int,_unsigned_int> *)
       std::
       vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
       ::begin(in_stack_ffffffffffffff48);
  local_48 = (pair<unsigned_int,_unsigned_int> *)
             std::
             vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
             ::end(in_stack_ffffffffffffff48);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (in_stack_ffffffffffffff50,
                       (__normal_iterator<std::pair<unsigned_int,_unsigned_int>_*,_std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_>
                        *)in_stack_ffffffffffffff48);
    if (!bVar1) break;
    local_50 = __gnu_cxx::
               __normal_iterator<std::pair<unsigned_int,_unsigned_int>_*,_std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_>
               ::operator*(&local_40);
    forward_like<std::vector<std::pair<unsigned_int,unsigned_int>,std::allocator<std::pair<unsigned_int,unsigned_int>>>&,std::pair<unsigned_int,unsigned_int>&>
              (local_50);
    local_78 = local_10;
    in_stack_ffffffffffffff68 =
         tuple_caster<std::pair,unsigned_int,unsigned_int>::
         cast<std::pair<unsigned_int,unsigned_int>&>
                   (in_stack_ffffffffffffff60.m_ptr,
                    (return_value_policy)((ulong)in_stack_ffffffffffffff58.m_ptr >> 0x38),
                    in_stack_ffffffffffffff68);
    local_60 = in_stack_ffffffffffffff68.m_ptr;
    reinterpret_steal<pybind11::object>(in_stack_ffffffffffffff58);
    bVar1 = pybind11::handle::operator_cast_to_bool(&local_58);
    if (bVar1) {
      in_stack_ffffffffffffff60 = object::release((object *)in_stack_ffffffffffffff48);
      local_88 = in_stack_ffffffffffffff60;
      ppPVar2 = pybind11::handle::ptr(&local_88);
      in_stack_ffffffffffffff58.m_ptr = *ppPVar2;
      ppPVar2 = pybind11::handle::ptr(local_28);
      (&(((*ppPVar2)[1].ob_type)->ob_base).ob_base.ob_refcnt)[local_30] =
           (Py_ssize_t)in_stack_ffffffffffffff58.m_ptr;
      local_30 = local_30 + 1;
    }
    else {
      memset(&local_8,0,8);
      pybind11::handle::handle(&local_8);
    }
    local_7c = (uint)!bVar1;
    object::~object((object *)0x2fc0fb);
    if (local_7c != 0) goto LAB_002fc159;
    __gnu_cxx::
    __normal_iterator<std::pair<unsigned_int,_unsigned_int>_*,_std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_>
    ::operator++(&local_40);
  }
  local_8 = object::release((object *)in_stack_ffffffffffffff48);
  local_7c = 1;
LAB_002fc159:
  list::~list((list *)0x2fc166);
  return (handle)local_8.m_ptr;
}

Assistant:

static handle cast(T &&src, return_value_policy policy, handle parent) {
        if (!std::is_lvalue_reference<T>::value)
            policy = return_value_policy_override<Value>::policy(policy);
        list l(src.size());
        size_t index = 0;
        for (auto &&value : src) {
            auto value_ = reinterpret_steal<object>(value_conv::cast(forward_like<T>(value), policy, parent));
            if (!value_)
                return handle();
            PyList_SET_ITEM(l.ptr(), (ssize_t) index++, value_.release().ptr()); // steals a reference
        }
        return l.release();
    }